

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_> * __thiscall
linq::IEnumerable<int>::Skip
          (IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_> *__return_storage_ptr__,
          IEnumerable<int> *this,size_t count)

{
  IEnumerable<int> local_30;
  
  IEnumerable(&local_30,this);
  IEnumerableCore<linq::IEnumerable<int>_>::Skip
            (__return_storage_ptr__,(IEnumerableCore<linq::IEnumerable<int>_> *)&local_30,count);
  ~IEnumerable(&local_30);
  return __return_storage_ptr__;
}

Assistant:

IEnumerableCore<SkipState<IEnumerable<T>, T>> IEnumerable<T>::Skip(size_t count) { return IEnumerableCore<IEnumerable<T>>(std::move(*this)).Skip(count); }